

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

BBox * __thiscall CGL::GLScene::Scene::get_bbox(Scene *this)

{
  bool bVar1;
  reference ppSVar2;
  BBox *in_RDI;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range2;
  BBox *bbox;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
  *in_stack_ffffffffffffff48;
  BBox *__lhs;
  undefined1 local_98 [16];
  BBox *in_stack_ffffffffffffff78;
  BBox *in_stack_ffffffffffffff80;
  BBox *in_stack_ffffffffffffffd0;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  local_20 [4];
  
  __lhs = in_RDI;
  BBox::BBox(in_stack_ffffffffffffffd0);
  local_20[0]._M_current =
       (SceneObject **)
       std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::begin
                 (in_stack_ffffffffffffff48);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::end
            (in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                        *)__lhs,(__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                                 *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
              ::operator*(local_20);
    (*(*ppSVar2)->_vptr_SceneObject[3])(local_98);
    BBox::expand(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
    ::operator++(local_20);
  }
  return in_RDI;
}

Assistant:

BBox Scene::get_bbox() {
  BBox bbox;
  for (SceneObject *obj : objects) {
    bbox.expand(obj->get_bbox());
  }
  return bbox;
}